

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

void __thiscall IR::RegOpnd::RegOpnd(RegOpnd *this,RegOpnd *other,StackSym *sym)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014d8690;
  ValueType::ValueType(&(this->super_Opnd).m_valueType);
  puVar1 = &(this->super_Opnd).field_0xb;
  *puVar1 = *puVar1 & 8;
  (this->super_Opnd).m_kind = OpndKindInvalid;
  (this->super_Opnd).isDeleted = false;
  (this->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014d8428;
  Initialize(this,sym,other->m_reg,(other->super_Opnd).m_type);
  (this->super_Opnd).m_valueType.field_0 = (other->super_Opnd).m_valueType.field_0;
  Opnd::SetIsJITOptimizedReg(&this->super_Opnd,(bool)(((other->super_Opnd).field_0xb & 8) >> 3));
  bVar3 = other->field_0x18 & 4;
  bVar2 = this->field_0x18;
  this->field_0x18 = bVar2 & 0xfb | bVar3;
  bVar4 = other->field_0x18 & 0x10;
  this->field_0x18 = bVar2 & 0xeb | bVar3 | bVar4;
  this->field_0x18 = bVar2 & 0xab | bVar3 | bVar4 | other->field_0x18 & 0x40;
  return;
}

Assistant:

RegOpnd::RegOpnd(const RegOpnd &other, StackSym *const sym)
{
    Initialize(sym, other.m_reg, other.m_type);

    m_valueType = other.m_valueType;
    SetIsJITOptimizedReg(other.GetIsJITOptimizedReg());
    m_dontDeadStore = other.m_dontDeadStore;
    m_wasNegativeZeroPreventedByBailout = other.m_wasNegativeZeroPreventedByBailout;

#if DBG
    m_symValueFrozen = other.m_symValueFrozen;
#endif
}